

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O0

exr_result_t
extract_attr_opaque(exr_context_t ctxt,_internal_exr_seq_scratch *scratch,
                   exr_attr_opaquedata_t *attrdata,char *aname,char *tname,int32_t attrsz)

{
  exr_result_t eVar1;
  char *in_RCX;
  long in_RDX;
  _internal_exr_seq_scratch *in_RSI;
  exr_attr_opaquedata_t *in_RDI;
  char *in_R8;
  int in_R9D;
  exr_result_t rv;
  int32_t n;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  eVar1 = check_bad_attrsz(in_RSI,(int32_t)((ulong)in_RDX >> 0x20),(int32_t)in_RDX,in_RCX,in_R8,
                           (int32_t *)CONCAT44(in_R9D,in_stack_ffffffffffffffc8));
  if (eVar1 == 0) {
    exr_attr_opaquedata_destroy
              ((exr_context_t)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
    eVar1 = exr_attr_opaquedata_init
                      ((exr_context_t)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       in_RDI,(size_t)in_RSI);
    if (eVar1 == 0) {
      eVar1 = (*in_RSI->sequential_read)(in_RSI,*(void **)(in_RDX + 0x10),(long)in_R9D);
      if (eVar1 == 0) {
        eVar1 = 0;
      }
      else {
        exr_attr_opaquedata_destroy
                  ((exr_context_t)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                   in_RDI);
        eVar1 = (*(code *)in_RDI[1].packed_data)
                          (in_RDI,10,"Attribute \'%s\': Unable to read opaque %s data (%d bytes)",
                           in_RCX,in_R8,in_R9D);
      }
    }
  }
  return eVar1;
}

Assistant:

static exr_result_t
extract_attr_opaque (
    exr_context_t                     ctxt,
    struct _internal_exr_seq_scratch* scratch,
    exr_attr_opaquedata_t*            attrdata,
    const char*                       aname,
    const char*                       tname,
    int32_t                           attrsz)
{
    int32_t      n;
    exr_result_t rv;

    rv = check_bad_attrsz (scratch, attrsz, 1, aname, tname, &n);
    if (rv != EXR_ERR_SUCCESS) return rv;

    exr_attr_opaquedata_destroy (ctxt, attrdata);
    rv = exr_attr_opaquedata_init (ctxt, attrdata, (uint64_t) attrsz);
    if (rv != EXR_ERR_SUCCESS) return rv;

    rv = scratch->sequential_read (
        scratch, (void*) attrdata->packed_data, (uint64_t) attrsz);
    if (rv != EXR_ERR_SUCCESS)
    {
        exr_attr_opaquedata_destroy (ctxt, attrdata);
        return ctxt->print_error (
            ctxt,
            EXR_ERR_READ_IO,
            "Attribute '%s': Unable to read opaque %s data (%d bytes)",
            aname,
            tname,
            attrsz);
    }
    return rv;
}